

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

void __thiscall
SQCompilation::CheckerVisitor::reportModifyIfContainer(CheckerVisitor *this,Expr *e,Expr *mod)

{
  uint uVar1;
  Node *pNVar2;
  bool bVar3;
  Node *pNVar4;
  bool bVar5;
  pointer pSVar6;
  bool bVar7;
  
  pSVar6 = (this->nodeStack).
           super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar6 == (this->nodeStack).
                super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
                ._M_impl.super__Vector_impl_data._M_start) {
    pNVar4 = (Node *)0x0;
    bVar7 = false;
  }
  else {
    bVar7 = false;
    pNVar4 = (Node *)0x0;
    do {
      if (pSVar6[-1].sst == SST_NODE) {
        pNVar2 = pSVar6[-1].field_1.n;
        bVar5 = true;
        if (pNVar2->_op == TO_FOREACH) {
          bVar3 = NodeEqualChecker::check
                            ((NodeEqualChecker *)&this->field_0x20,*(Node **)&pNVar2[1]._op,
                             &e->super_Node);
          bVar5 = !bVar3;
          pNVar4 = pNVar2;
          if (bVar3) {
            bVar7 = true;
          }
        }
        if (!bVar5) break;
      }
      pSVar6 = pSVar6 + -1;
    } while (pSVar6 != (this->nodeStack).
                       super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
                       ._M_impl.super__Vector_impl_data._M_start);
  }
  if (!bVar7) {
    return;
  }
  for (pSVar6 = (this->nodeStack).
                super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pSVar6 != (this->nodeStack).
                super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
                ._M_impl.super__Vector_impl_data._M_start; pSVar6 = pSVar6 + -1) {
    if (pSVar6[-1].sst == SST_NODE) {
      pNVar2 = pSVar6[-1].field_1.n;
      if (pNVar2 == pNVar4) break;
      if (((pNVar2->_op == TO_BLOCK) &&
          (uVar1 = *(uint *)(*(long *)(*(long *)&pNVar2[1]._coordinates +
                                      (ulong)(pNVar2[1]._coordinates.lineEnd - 1) * 8) + 0x18),
          uVar1 < 0xc)) && ((0xa80U >> (uVar1 & 0x1f) & 1) != 0)) {
        return;
      }
    }
  }
  report(this,&mod->super_Node,0x80);
  return;
}

Assistant:

void CheckerVisitor::reportModifyIfContainer(const Expr *e, const Expr *mod) {
  bool found = false;
  const ForeachStatement *f = nullptr;
  for (auto it = nodeStack.rbegin(); it != nodeStack.rend(); ++it) {
    if (it->sst != SST_NODE)
      continue;

    const Node *n = it->n;
    if (n->op() == TO_FOREACH) {
      f = static_cast<const ForeachStatement *>(n);

      if (_equalChecker.check(f->container(), e)) {
        found = true;
        break;
      }
    }
  }

  if (!found)
    return;

  for (auto it = nodeStack.rbegin(); it != nodeStack.rend(); ++it) {
    if (it->sst != SST_NODE)
      continue;

    if (it->n == f)
      break;

    const Node *n = it->n;

    if (n->op() == TO_BLOCK) {
      const auto &stmts = static_cast<const Block *>(n)->statements();
      assert(stmts.size() > 0);
      const Statement *stmt = stmts.back();
      if (stmt->op() == TO_RETURN || stmt->op() == TO_THROW || stmt->op() == TO_BREAK)
        return;
    }
  }

  report(mod, DiagnosticsId::DI_MODIFIED_CONTAINER);
}